

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O3

void yaml_parser_delete(yaml_parser_t *parser)

{
  uchar *__ptr;
  yaml_char_t *pyVar1;
  yaml_token_t *pyVar2;
  int *__ptr_00;
  yaml_simple_key_t *__ptr_01;
  yaml_parser_state_t *__ptr_02;
  yaml_mark_t *__ptr_03;
  yaml_tag_directive_t *__ptr_04;
  yaml_tag_directive_t *pyVar3;
  
  if (parser != (yaml_parser_t *)0x0) {
    __ptr = (parser->raw_buffer).start;
    if (__ptr != (uchar *)0x0) {
      free(__ptr);
    }
    (parser->raw_buffer).start = (uchar *)0x0;
    (parser->raw_buffer).end = (uchar *)0x0;
    (parser->raw_buffer).pointer = (uchar *)0x0;
    pyVar1 = (parser->buffer).start;
    if (pyVar1 != (yaml_char_t *)0x0) {
      free(pyVar1);
    }
    (parser->buffer).start = (yaml_char_t *)0x0;
    (parser->buffer).end = (yaml_char_t *)0x0;
    (parser->buffer).pointer = (yaml_char_t *)0x0;
    while (pyVar2 = (parser->tokens).head, pyVar2 != (parser->tokens).tail) {
      (parser->tokens).head = pyVar2 + 1;
      yaml_token_delete(pyVar2);
    }
    pyVar2 = (parser->tokens).start;
    if (pyVar2 != (yaml_token_t *)0x0) {
      free(pyVar2);
    }
    (parser->tokens).head = (yaml_token_t *)0x0;
    (parser->tokens).tail = (yaml_token_t *)0x0;
    (parser->tokens).start = (yaml_token_t *)0x0;
    (parser->tokens).end = (yaml_token_t *)0x0;
    __ptr_00 = (parser->indents).start;
    if (__ptr_00 != (int *)0x0) {
      free(__ptr_00);
    }
    (parser->indents).start = (int *)0x0;
    (parser->indents).end = (int *)0x0;
    (parser->indents).top = (int *)0x0;
    __ptr_01 = (parser->simple_keys).start;
    if (__ptr_01 != (yaml_simple_key_t *)0x0) {
      free(__ptr_01);
    }
    (parser->simple_keys).start = (yaml_simple_key_t *)0x0;
    (parser->simple_keys).end = (yaml_simple_key_t *)0x0;
    (parser->simple_keys).top = (yaml_simple_key_t *)0x0;
    __ptr_02 = (parser->states).start;
    if (__ptr_02 != (yaml_parser_state_t *)0x0) {
      free(__ptr_02);
    }
    (parser->states).start = (yaml_parser_state_t *)0x0;
    (parser->states).end = (yaml_parser_state_t *)0x0;
    (parser->states).top = (yaml_parser_state_t *)0x0;
    __ptr_03 = (parser->marks).start;
    if (__ptr_03 != (yaml_mark_t *)0x0) {
      free(__ptr_03);
    }
    (parser->marks).start = (yaml_mark_t *)0x0;
    (parser->marks).end = (yaml_mark_t *)0x0;
    (parser->marks).top = (yaml_mark_t *)0x0;
    while( true ) {
      __ptr_04 = (parser->tag_directives).start;
      pyVar3 = (parser->tag_directives).top;
      if (__ptr_04 == pyVar3) break;
      (parser->tag_directives).top = pyVar3 + -1;
      pyVar1 = pyVar3[-1].prefix;
      if (pyVar3[-1].handle != (yaml_char_t *)0x0) {
        free(pyVar3[-1].handle);
      }
      if (pyVar1 != (yaml_char_t *)0x0) {
        free(pyVar1);
      }
    }
    if (__ptr_04 != (yaml_tag_directive_t *)0x0) {
      free(__ptr_04);
    }
    memset(parser,0,0x1e0);
    return;
  }
  __assert_fail("parser",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                ,0xde,"void yaml_parser_delete(yaml_parser_t *)");
}

Assistant:

YAML_DECLARE(void)
yaml_parser_delete(yaml_parser_t *parser)
{
    assert(parser); /* Non-NULL parser object expected. */

    BUFFER_DEL(parser, parser->raw_buffer);
    BUFFER_DEL(parser, parser->buffer);
    while (!QUEUE_EMPTY(parser, parser->tokens)) {
        yaml_token_delete(&DEQUEUE(parser, parser->tokens));
    }
    QUEUE_DEL(parser, parser->tokens);
    STACK_DEL(parser, parser->indents);
    STACK_DEL(parser, parser->simple_keys);
    STACK_DEL(parser, parser->states);
    STACK_DEL(parser, parser->marks);
    while (!STACK_EMPTY(parser, parser->tag_directives)) {
        yaml_tag_directive_t tag_directive = POP(parser, parser->tag_directives);
        yaml_free(tag_directive.handle);
        yaml_free(tag_directive.prefix);
    }
    STACK_DEL(parser, parser->tag_directives);

    memset(parser, 0, sizeof(yaml_parser_t));
}